

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

ArrayType * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::ArrayType,(anonymous_namespace)::Node*&,StringView&>
          (Db *this,Node **args,StringView *args_1)

{
  Node *Base_;
  ArrayType *this_00;
  NodeOrString local_30;
  StringView *local_20;
  StringView *args_local_1;
  Node **args_local;
  Db *this_local;
  
  local_20 = args_1;
  args_local_1 = (StringView *)args;
  args_local = (Node **)this;
  this_00 = (ArrayType *)
            anon_unknown.dwarf_4447fb::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  Base_ = (Node *)args_local_1->First;
  anon_unknown.dwarf_4447fb::NodeOrString::NodeOrString(&local_30,*local_20);
  anon_unknown.dwarf_4447fb::ArrayType::ArrayType(this_00,Base_,local_30);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }